

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall bsplib::Rdma::PushPopCommBuf::serialize(PushPopCommBuf *this,A2A *a2a)

{
  unsigned_long x;
  bool bVar1;
  pointer pPVar2;
  ulong uVar3;
  pointer puVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  uint __fd;
  ulong uVar8;
  int __fd_00;
  Buffer nbuf;
  byte local_52 [10];
  long local_48;
  size_t local_40;
  unsigned_long local_38;
  
  lVar6 = (long)(this->m_popped_slots).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_popped_slots).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  sVar5 = 0;
  uVar8 = (long)(this->m_pushed_slots).
                super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_pushed_slots).
                super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  do {
    local_52[sVar5] = (0x7f < uVar8) << 7 | (byte)uVar8 & 0x7f;
    sVar5 = sVar5 + 1;
    bVar1 = 0x7f < uVar8;
    uVar8 = uVar8 >> 7;
  } while (bVar1);
  __fd = 0;
  lVar7 = lVar6;
  if (0 < a2a->m_nprocs) {
    do {
      local_40 = sVar5;
      local_48 = lVar7;
      A2A::send(a2a,__fd,local_52,local_40,(int)lVar6);
      pPVar2 = (this->m_pushed_slots).
               super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_pushed_slots).
          super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish != pPVar2) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          x = *(unsigned_long *)((long)&(pPVar2->block).size + lVar7);
          local_38 = *(unsigned_long *)((long)&pPVar2->slot + lVar7);
          serial<unsigned_long>(a2a,__fd,*(unsigned_long *)((long)&(pPVar2->block).addr + lVar7));
          serial<unsigned_long>(a2a,__fd,x);
          serial<unsigned_long>(a2a,__fd,local_38);
          uVar8 = uVar8 + 1;
          pPVar2 = (this->m_pushed_slots).
                   super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x20;
        } while (uVar8 < (ulong)((long)(this->m_pushed_slots).
                                       super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >>
                                5));
      }
      __fd = __fd + 1;
      lVar7 = local_48;
      sVar5 = local_40;
    } while ((int)__fd < a2a->m_nprocs);
    __fd = (uint)(0 < a2a->m_nprocs);
    lVar6 = local_48;
  }
  sVar5 = 0;
  uVar8 = lVar6 >> 3;
  do {
    uVar3 = uVar8 >> 7;
    local_52[sVar5] = (0x7f < uVar8) << 7 | (byte)uVar8 & 0x7f;
    sVar5 = sVar5 + 1;
    bVar1 = 0x7f < uVar8;
    uVar8 = uVar3;
  } while (bVar1);
  if ((char)__fd != '\0') {
    __fd_00 = 0;
    do {
      A2A::send(a2a,__fd_00,local_52,sVar5,(int)uVar3);
      puVar4 = (this->m_popped_slots).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_popped_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar4) {
        uVar8 = 0;
        do {
          serial<unsigned_long>(a2a,__fd_00,puVar4[uVar8]);
          uVar8 = uVar8 + 1;
          puVar4 = (this->m_popped_slots).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(this->m_popped_slots).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >>
                                3));
      }
      __fd_00 = __fd_00 + 1;
    } while (__fd_00 < a2a->m_nprocs);
  }
  return;
}

Assistant:

void Rdma::PushPopCommBuf::serialize( A2A & a2a ) 
{
    typedef UIntSerialize< size_t >    SizeSer;

    const size_t n_pushed_slots = m_pushed_slots.size();
    const size_t n_popped_slots = m_popped_slots.size();

    // broadcast pushed slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_pushed_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_pushed_slots.size(); ++s) {
            PushEntry entry = m_pushed_slots[s];
            char * null = NULL;
            size_t addr = static_cast<char *>(entry.block.addr) - null;
            size_t size = entry.block.size;
            size_t id = entry.slot;
            
            serial( a2a, p, addr );
            serial( a2a, p, size );
            serial( a2a, p, id );
        }
    } }

    // broadcast popped slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_popped_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_popped_slots.size(); ++s) {
            Memslot slotid = m_popped_slots[s];
            serial( a2a, p, slotid );
        }
    } }
}